

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::AlphaToCoverageInstance::verifyImage
          (TestStatus *__return_storage_ptr__,AlphaToCoverageInstance *this,
          ConstPixelBufferAccess *result)

{
  uint uVar1;
  ostream *poVar2;
  int z;
  int y;
  ostringstream message;
  float local_1cc;
  undefined1 local_1c8 [32];
  ConstPixelBufferAccess local_1a8 [9];
  
  uVar1 = this->m_geometryType - GEOMETRY_TYPE_OPAQUE_QUAD;
  local_1cc = 0.0;
  if (uVar1 < 5) {
    local_1cc = *(float *)(&DAT_00958bb0 + (ulong)uVar1 * 4);
  }
  z = 0;
  do {
    if ((this->m_renderSize).m_data[1] <= z) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,"Image matches reference value",(allocator<char> *)local_1c8);
      tcu::TestStatus::pass(__return_storage_ptr__,(string *)local_1a8);
      std::__cxx11::string::~string((string *)local_1a8);
      return __return_storage_ptr__;
    }
    for (y = 0; y < (this->m_renderSize).m_data[0]; y = y + 1) {
      tcu::ConstPixelBufferAccess::getPixel(local_1a8,(int)result,y,z);
      if (local_1cc < (float)local_1a8[0].m_format.order) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar2 = std::operator<<((ostream *)local_1a8,"Pixel is not below the threshold value (");
        tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_1c8,(int)result,y,z);
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(float)local_1c8._0_4_);
        poVar2 = std::operator<<(poVar2," > ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1cc);
        std::operator<<(poVar2,")");
        std::__cxx11::stringbuf::str();
        tcu::TestStatus::fail(__return_storage_ptr__,(string *)local_1c8);
        std::__cxx11::string::~string((string *)local_1c8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        return __return_storage_ptr__;
      }
    }
    z = z + 1;
  } while( true );
}

Assistant:

tcu::TestStatus AlphaToCoverageInstance::verifyImage (const tcu::ConstPixelBufferAccess&	result)
{
	float maxColorValue;

	switch (m_geometryType)
	{
		case GEOMETRY_TYPE_OPAQUE_QUAD:
			maxColorValue = 1.01f;
			break;

		case GEOMETRY_TYPE_TRANSLUCENT_QUAD:
			maxColorValue = 0.52f;
			break;

		case GEOMETRY_TYPE_INVISIBLE_QUAD:
			maxColorValue = 0.01f;
			break;

		default:
			maxColorValue = 0.0f;
			DE_ASSERT(false);
	}

	for (int y = 0; y < m_renderSize.y(); y++)
	{
		for (int x = 0; x < m_renderSize.x(); x++)
		{
			if (result.getPixel(x, y).x() > maxColorValue)
			{
				std::ostringstream message;
				message << "Pixel is not below the threshold value (" << result.getPixel(x, y).x() << " > " << maxColorValue << ")";
				return tcu::TestStatus::fail(message.str());
			}
		}
	}

	return tcu::TestStatus::pass("Image matches reference value");
}